

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
bssl::der::test::ParserTest_CanReadRawTLV_Test::TestBody(ParserTest_CanReadRawTLV_Test *this)

{
  Input in;
  bool bVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  pointer *__ptr;
  Input input;
  Input tlv_data;
  ByteReader tlv_reader;
  uint8_t der [3];
  size_t tlv_len;
  Input tlv;
  Parser parser;
  AssertHelper local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  Input local_68;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  uchar local_44 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  Input local_38;
  Parser local_28;
  
  local_44[2] = 1;
  local_44[0] = '\x02';
  local_44[1] = '\x01';
  input.data_.size_ = 3;
  input.data_.data_ = local_44;
  Parser::Parser(&local_28,input);
  local_38.data_.data_ = (uchar *)0x0;
  local_38.data_.size_ = 0;
  local_58[0] = (internal)Parser::ReadRawTLV(&local_28,&local_38);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_58[0]) {
    in.data_.size_ = local_38.data_.size_;
    in.data_.data_ = local_38.data_.data_;
    ByteReader::ByteReader((ByteReader *)local_58,in);
    local_40 = local_50;
    local_68.data_.data_ = (uchar *)CONCAT44(local_68.data_.data_._4_4_,3);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_88,"3u","tlv_len",(uint *)&local_68,(unsigned_long *)&local_40);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
                 ,0x29,message);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((long *)local_68.data_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_68.data_.data_ + 8))();
      }
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_80;
      goto LAB_00296796;
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68.data_.data_ = (uchar *)0x0;
    local_68.data_.size_ = 0;
    local_a8.data_._0_1_ =
         (internal)ByteReader::ReadBytes((ByteReader *)local_58,(size_t)local_40,&local_68);
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_a8.data_._0_1_) {
      bVar1 = Parser::HasMore(&local_28);
      local_a8.data_._0_1_ = (internal)!bVar1;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_a8.data_._0_1_) {
        return;
      }
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_a8,(AssertionResult *)"parser.HasMore()",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
                 ,0x2c,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    }
    else {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_a8,
                 (AssertionResult *)"tlv_reader.ReadBytes(tlv_len, &tlv_data)","false","true",in_R9)
      ;
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
                 ,0x2b,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_a0;
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    local_80 = local_a0;
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
      local_80 = local_a0;
    }
  }
  else {
    testing::Message::Message((Message *)&local_68);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_50;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_58,(AssertionResult *)"parser.ReadRawTLV(&tlv)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
               ,0x26,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    local_80 = local_50;
    if ((long *)local_68.data_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_68.data_.data_ + 8))();
      local_80 = local_50;
    }
  }
  if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
LAB_00296796:
  ::std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_80);
  return;
}

Assistant:

TEST(ParserTest, CanReadRawTLV) {
  const uint8_t der[] = {0x02, 0x01, 0x01};
  Parser parser((Input(der)));
  Input tlv;
  ASSERT_TRUE(parser.ReadRawTLV(&tlv));
  ByteReader tlv_reader(tlv);
  size_t tlv_len = tlv_reader.BytesLeft();
  ASSERT_EQ(3u, tlv_len);
  Input tlv_data;
  ASSERT_TRUE(tlv_reader.ReadBytes(tlv_len, &tlv_data));
  ASSERT_FALSE(parser.HasMore());
}